

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtpudpv6transmitter.cpp
# Opt level: O1

void __thiscall jrtplib::RTPUDPv6Transmitter::LeaveAllMulticastGroups(RTPUDPv6Transmitter *this)

{
  HashElement *pHVar1;
  HashElement *pHVar2;
  RTPMemoryManager *pRVar3;
  ipv6_mreq mreq;
  in6_addr mcastIP;
  undefined8 local_48;
  undefined8 uStack_40;
  uint local_38;
  undefined8 local_28;
  undefined8 uStack_20;
  
  if (this->init == true) {
    if (this->created == true) {
      pHVar1 = (this->multicastgroups).firsthashelem;
      (this->multicastgroups).curhashelem = pHVar1;
      while (pHVar1 != (HashElement *)0x0) {
        local_48 = *(undefined8 *)&(pHVar1->element).__in6_u;
        uStack_40 = *(undefined8 *)((long)&(pHVar1->element).__in6_u + 8);
        local_38 = this->mcastifidx;
        local_28 = local_48;
        uStack_20 = uStack_40;
        setsockopt(this->rtpsock,0x29,0x15,&local_48,0x14);
        local_48 = local_28;
        uStack_40 = uStack_20;
        local_38 = this->mcastifidx;
        setsockopt(this->rtcpsock,0x29,0x15,&local_48,0x14);
        pHVar1 = (this->multicastgroups).curhashelem;
        if (pHVar1 != (HashElement *)0x0) {
          (this->multicastgroups).curhashelem = pHVar1->listnext;
        }
        pHVar1 = (this->multicastgroups).curhashelem;
      }
      memset((this->multicastgroups).table,0,0x103e8);
      pHVar1 = (this->multicastgroups).firsthashelem;
      while (pHVar1 != (HashElement *)0x0) {
        pHVar2 = pHVar1->listnext;
        pRVar3 = (this->multicastgroups).super_RTPMemoryObject.mgr;
        if (pRVar3 == (RTPMemoryManager *)0x0) {
          operator_delete(pHVar1,0x38);
          pHVar1 = pHVar2;
        }
        else {
          (**(code **)(*(long *)pRVar3 + 0x18))(pRVar3,pHVar1);
          pHVar1 = pHVar2;
        }
      }
      (this->multicastgroups).firsthashelem = (HashElement *)0x0;
      (this->multicastgroups).lasthashelem = (HashElement *)0x0;
    }
  }
  return;
}

Assistant:

void RTPUDPv6Transmitter::LeaveAllMulticastGroups()
{
	if (!init)
		return;
	
	MAINMUTEX_LOCK
	if (created)
	{
		multicastgroups.GotoFirstElement();
		while (multicastgroups.HasCurrentElement())
		{
			in6_addr mcastIP;
			int status = 0;

			mcastIP = multicastgroups.GetCurrentElement();
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			RTPUDPV6TRANS_MCASTMEMBERSHIP(rtcpsock,IPV6_LEAVE_GROUP,mcastIP,status);
			multicastgroups.GotoNextElement();
			JRTPLIB_UNUSED(status);
		}
		multicastgroups.Clear();
	}
	MAINMUTEX_UNLOCK
}